

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O3

string * duckdb::AddEscapes(string *__return_storage_ptr__,char to_be_escaped,char escape,
                           string *val)

{
  string *psVar1;
  string *psVar2;
  undefined7 in_register_00000031;
  char cVar3;
  ulong uVar4;
  string *psVar5;
  string *psVar6;
  
  uVar4 = CONCAT71(in_register_00000031,to_be_escaped) & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_4ed193b + 9);
  psVar5 = (string *)0x0;
  psVar1 = (string *)::std::__cxx11::string::find((char)val,uVar4);
  cVar3 = (char)__return_storage_ptr__;
  psVar2 = psVar1;
  if (psVar1 != (string *)0xffffffffffffffff) {
    psVar5 = (string *)0x0;
    psVar2 = (string *)(ulong)(uint)(int)escape;
    do {
      psVar6 = psVar5;
      if (psVar5 < psVar1) {
        do {
          psVar2 = (string *)::std::__cxx11::string::push_back(cVar3);
          psVar6 = (string *)((long)&(psVar6->_M_dataplus)._M_p + 1);
          psVar5 = psVar1;
        } while (psVar1 != psVar6);
      }
      if (escape != '\0') {
        ::std::__cxx11::string::push_back(cVar3);
        psVar2 = (string *)::std::__cxx11::string::find((char)val,(ulong)(uint)(int)(char)uVar4);
        psVar1 = psVar2;
      }
    } while (psVar1 != (string *)0xffffffffffffffff);
  }
  for (; psVar5 < (string *)val->_M_string_length;
      psVar5 = (string *)((long)&(psVar5->_M_dataplus)._M_p + 1)) {
    psVar2 = (string *)::std::__cxx11::string::push_back(cVar3);
  }
  return psVar2;
}

Assistant:

static string AddEscapes(char to_be_escaped, const char escape, const string &val) {
	idx_t i = 0;
	string new_val = "";
	idx_t found = val.find(to_be_escaped);

	while (found != string::npos) {
		while (i < found) {
			new_val += val[i];
			i++;
		}
		if (escape != '\0') {
			new_val += escape;
			found = val.find(to_be_escaped, found + 1);
		}
	}
	while (i < val.length()) {
		new_val += val[i];
		i++;
	}
	return new_val;
}